

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.hpp
# Opt level: O3

void __thiscall
libtorrent::aux::chained_buffer::append_buffer<libtorrent::aux::buffer>
          (chained_buffer *this,buffer *buffer,int used_size)

{
  char *pcVar1;
  difference_type dVar2;
  _Elt_pointer pbVar3;
  int iVar4;
  
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::emplace_back<>(&this->m_vec);
  pbVar3 = (this->m_vec).
           super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar3 == (this->m_vec).
                super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar3 = (this->m_vec).
             super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 8;
  }
  pcVar1 = buffer->m_begin;
  dVar2 = buffer->m_size;
  buffer->m_begin = (char *)0x0;
  buffer->m_size = 0;
  pbVar3[-1].buf = pcVar1;
  iVar4 = (int)dVar2;
  pbVar3[-1].size = iVar4;
  pbVar3[-1].used_size = used_size;
  pbVar3[-1].destruct_holder =
       init_buffer_entry<libtorrent::aux::buffer>::anon_class_1_0_00000001::__invoke;
  *(char **)pbVar3[-1].holder._M_elems = pcVar1;
  *(difference_type *)(pbVar3[-1].holder._M_elems + 8) = dVar2;
  this->m_bytes = this->m_bytes + used_size;
  this->m_capacity = this->m_capacity + iVar4;
  return;
}

Assistant:

void append_buffer(Holder buffer, int used_size)
		{
			TORRENT_ASSERT(is_single_thread());
			TORRENT_ASSERT(int(buffer.size()) >= used_size);
			m_vec.emplace_back();
			buffer_t& b = m_vec.back();
			init_buffer_entry<Holder>(b, std::move(buffer), used_size);
		}